

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O3

void kratos::TransformIfCase::transform_block(StmtBlock *stmts)

{
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *pvVar1;
  pointer psVar2;
  Stmt *stmt;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  element_type *peVar3;
  element_type *this_00;
  bool bVar4;
  int iVar5;
  long lVar6;
  pointer index;
  long lVar7;
  undefined1 local_88 [32];
  shared_ptr<kratos::SwitchStmt> switch_stmt;
  undefined1 local_50 [8];
  Var *target;
  vector<std::shared_ptr<kratos::IfStmt>,_std::allocator<std::shared_ptr<kratos::IfStmt>_>_>
  if_stmts;
  
  lVar6 = (long)(stmts->stmts_).
                super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(stmts->stmts_).
                super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (lVar6 != 0) {
    lVar6 = lVar6 >> 4;
    local_88._16_8_ = lVar6 + (ulong)(lVar6 == 0);
    lVar6 = 8;
    index = (pointer)0x0;
    do {
      psVar2 = (stmts->stmts_).
               super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      stmt = *(Stmt **)((long)psVar2 + lVar6 + -8);
      this = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
              ((long)&(psVar2->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
              + lVar6);
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this->_M_use_count = this->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this->_M_use_count = this->_M_use_count + 1;
        }
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      }
      local_50 = (undefined1  [8])0x0;
      if_stmts.
      super__Vector_base<std::shared_ptr<kratos::IfStmt>,_std::allocator<std::shared_ptr<kratos::IfStmt>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      target = (Var *)0x0;
      if_stmts.
      super__Vector_base<std::shared_ptr<kratos::IfStmt>,_std::allocator<std::shared_ptr<kratos::IfStmt>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      bVar4 = has_target_if(stmt,(Var **)local_50,
                            (vector<std::shared_ptr<kratos::IfStmt>,_std::allocator<std::shared_ptr<kratos::IfStmt>_>_>
                             *)&target);
      if (bVar4 && local_50 != (undefined1  [8])0x0) {
        lVar7 = (long)if_stmts.
                      super__Vector_base<std::shared_ptr<kratos::IfStmt>,_std::allocator<std::shared_ptr<kratos::IfStmt>_>_>
                      ._M_impl.super__Vector_impl_data._M_start - (long)target;
        iVar5 = (**(code **)(*(long *)local_50 + 0x38))();
        if ((iVar5 != 0) &&
           (((ulong)(uint)(1 << ((byte)iVar5 & 0x1f)) <= (ulong)(lVar7 >> 4) ||
            (peVar3 = ((if_stmts.
                        super__Vector_base<std::shared_ptr<kratos::IfStmt>,_std::allocator<std::shared_ptr<kratos::IfStmt>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[-1].
                        super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      else_body_).
                      super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            , (peVar3->super_StmtBlock).stmts_.
              super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              *(pointer *)
               ((long)&(peVar3->super_StmtBlock).stmts_.
                       super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
               + 8))))) {
          Stmt::as<kratos::IfStmt>((Stmt *)local_88);
          change_if_to_switch((TransformIfCase *)(local_88 + 0x18),
                              (shared_ptr<kratos::IfStmt> *)local_88,
                              (vector<std::shared_ptr<kratos::IfStmt>,_std::allocator<std::shared_ptr<kratos::IfStmt>_>_>
                               *)&target);
          if ((pointer)local_88._8_8_ != (pointer)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
          }
          this_00 = switch_stmt.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr;
          switch_stmt.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._24_8_;
          if (switch_stmt.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              != (element_type *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              pvVar1 = &((switch_stmt.
                          super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                        ->super_Stmt).super_IRNode.fn_name_ln;
              *(int *)&(pvVar1->
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                       )._M_impl.super__Vector_impl_data._M_start =
                   *(int *)&(pvVar1->
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 1;
              UNLOCK();
            }
            else {
              pvVar1 = &((switch_stmt.
                          super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                        ->super_Stmt).super_IRNode.fn_name_ln;
              *(int *)&(pvVar1->
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                       )._M_impl.super__Vector_impl_data._M_start =
                   *(int *)&(pvVar1->
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 1;
            }
          }
          StmtBlock::set_child
                    (stmts,(uint64_t)index,
                     (shared_ptr<kratos::Stmt> *)
                     &switch_stmt.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
          if (this_00 != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
          }
          if (switch_stmt.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       switch_stmt.
                       super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          }
        }
      }
      std::
      vector<std::shared_ptr<kratos::IfStmt>,_std::allocator<std::shared_ptr<kratos::IfStmt>_>_>::
      ~vector((vector<std::shared_ptr<kratos::IfStmt>,_std::allocator<std::shared_ptr<kratos::IfStmt>_>_>
               *)&target);
      index = (pointer)((long)&(index->first)._M_dataplus._M_p + 1);
      lVar6 = lVar6 + 0x10;
    } while ((pointer)local_88._16_8_ != index);
  }
  return;
}

Assistant:

void static transform_block(StmtBlock* stmts) {
        auto const stmt_count = stmts->size();
        for (uint64_t i = 0; i < stmt_count; i++) {
            auto* stmt = stmts->get_stmt(i).get();
            Var* target = nullptr;
            std::vector<std::shared_ptr<IfStmt>> if_stmts;
            if (has_target_if(stmt, target, if_stmts) && target) {
                uint64_t cases = if_stmts.size();
                uint64_t expected_case = 1u << target->width();
                bool has_else = !(if_stmts.back()->else_body()->empty());
                if (expected_case > 1 && (cases >= expected_case || has_else)) {
                    auto switch_stmt = change_if_to_switch(stmt->as<IfStmt>(), if_stmts);
                    stmts->set_child(i, switch_stmt);
                }
            }
        }
    }